

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsequentialanimationgroup.cpp
# Opt level: O1

void QSequentialAnimationGroup::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QObjectData *pQVar1;
  QBindingStatus *pQVar2;
  long *plVar3;
  __atomic_base<int> _Var4;
  undefined8 *puVar5;
  long in_FS_OFFSET;
  undefined8 local_50;
  void *local_48;
  undefined8 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      QSequentialAnimationGroupPrivate::_q_uncontrolledAnimationFinished
                ((QSequentialAnimationGroupPrivate *)(_o->d_ptr).d);
    }
    else if (_id == 0) {
      local_50 = *_a[1];
      puStack_40 = &local_50;
      local_48 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_48);
    }
    switch(_c) {
    case ReadProperty:
      goto switchD_003bb021_caseD_1;
    case IndexOfMethod:
      goto switchD_003bb021_caseD_5;
    case RegisterPropertyMetaType:
      goto switchD_003bb021_caseD_6;
    case RegisterMethodArgumentMetaType:
      goto switchD_003bb021_caseD_7;
    }
    break;
  case ReadProperty:
switchD_003bb021_caseD_1:
    if (_id == 0) {
LAB_003bb12b:
      puVar5 = (undefined8 *)*_a;
      pQVar1 = (_o->d_ptr).d;
      pQVar2 = (pQVar1->bindingStorage).bindingStatus;
      if ((pQVar2 != (QBindingStatus *)0x0) &&
         (pQVar2->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper
                  (&pQVar1->bindingStorage,(QUntypedPropertyData *)&pQVar1[2].children);
      }
      *puVar5 = pQVar1[2].children.d.d;
    }
    break;
  case IndexOfMethod:
switchD_003bb021_caseD_5:
    if ((*_a[1] == currentAnimationChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      goto LAB_003bb17f;
    }
    if (_c == ReadProperty) goto switchD_003bb021_caseD_1;
    if (_c == RegisterPropertyMetaType) goto switchD_003bb021_caseD_6;
    break;
  case RegisterPropertyMetaType:
switchD_003bb021_caseD_6:
    _Var4._M_i = -1;
    if ((_id == 0) &&
       (_Var4._M_i = (__int_type_conflict)
                     QtPrivate::QMetaTypeInterfaceWrapper<QAbstractAnimation_*>::metaType.typeId.
                     _q_value.super___atomic_base<int>._M_i,
       (__atomic_base<int>)
       QtPrivate::QMetaTypeInterfaceWrapper<QAbstractAnimation_*>::metaType.typeId._q_value.
       super___atomic_base<int>._M_i == (__atomic_base<int>)0x0)) {
      _Var4._M_i = QMetaType::registerHelper
                             (&QtPrivate::QMetaTypeInterfaceWrapper<QAbstractAnimation_*>::metaType)
      ;
    }
    ((__atomic_base<int> *)*_a)->_M_i = _Var4._M_i;
    if (_c == ReadProperty && _id == 0) goto LAB_003bb12b;
    break;
  case RegisterMethodArgumentMetaType:
switchD_003bb021_caseD_7:
    if (_id == 0) {
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] != 0) goto LAB_003bb0a9;
      *puVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractAnimation_*>::metaType;
    }
    else {
      puVar5 = (undefined8 *)*_a;
LAB_003bb0a9:
      *puVar5 = 0;
    }
    if (_c == ReadProperty) goto switchD_003bb021_caseD_1;
    if (_c == RegisterPropertyMetaType) goto switchD_003bb021_caseD_6;
    if (_c == IndexOfMethod) goto switchD_003bb021_caseD_5;
  }
  if (_c == BindableProperty && _id == 0) {
    plVar3 = (long *)*_a;
    *plVar3 = (long)&(_o->d_ptr).d[2].children;
    plVar3[1] = (long)&QtPrivate::
                       QBindableInterfaceForProperty<const_QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>,_void>
                       ::iface;
  }
LAB_003bb17f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSequentialAnimationGroup::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSequentialAnimationGroup *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentAnimationChanged((*reinterpret_cast< std::add_pointer_t<QAbstractAnimation*>>(_a[1]))); break;
        case 1: _t->d_func()->_q_uncontrolledAnimationFinished(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractAnimation* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSequentialAnimationGroup::*)(QAbstractAnimation * )>(_a, &QSequentialAnimationGroup::currentAnimationChanged, 0))
            return;
    }
    if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 0:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QAbstractAnimation* >(); break;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QAbstractAnimation**>(_v) = _t->currentAnimation(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableCurrentAnimation(); break;
        default: break;
        }
    }
}